

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

char * __thiscall cppcms::impl::string_pool::allocate_space(string_pool *this,size_t size)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong in_RSI;
  bad_alloc *in_RDI;
  char *result;
  page *p;
  string_pool *in_stack_ffffffffffffffe0;
  char *local_8;
  
  if (in_RSI * 2 < *(ulong *)in_RDI || in_RSI * 2 - *(ulong *)in_RDI == 0) {
    if (*(ulong *)(in_RDI + 0x10) < in_RSI) {
      add_page(in_stack_ffffffffffffffe0);
    }
    local_8 = *(char **)(in_RDI + 0x18);
    *(ulong *)(in_RDI + 0x18) = in_RSI + *(ulong *)(in_RDI + 0x18);
    *(ulong *)(in_RDI + 0x10) = *(ulong *)(in_RDI + 0x10) - in_RSI;
  }
  else {
    puVar1 = (undefined8 *)malloc(in_RSI + 0x10);
    if (puVar1 == (undefined8 *)0x0) {
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_RDI);
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *puVar1 = **(undefined8 **)(in_RDI + 8);
    **(undefined8 **)(in_RDI + 8) = puVar1;
    local_8 = (char *)(puVar1 + 1);
  }
  return local_8;
}

Assistant:

char *allocate_space(size_t size)
			{
				if(size * 2 > page_size_) {
					page *p=(page *)malloc(size + sizeof(page));
					if(!p)
						throw std::bad_alloc();
					p->next = pages_->next;
					pages_->next = p;
					return p->data;
				}
				if(size > free_space_) {
					add_page();
				}
				char *result = data_;
				data_+=size;
				free_space_ -= size;
				return result;
			}